

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

void __thiscall
flatbuffers::ts::TsGenerator::GenerateFinisher
          (TsGenerator *this,StructDef *struct_def,string *code_ptr,string *code,bool size_prefixed)

{
  Parser *pPVar1;
  string sizePrefixed;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48 [32];
  
  if (((this->super_BaseGenerator).parser_)->root_struct_def_ == struct_def) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_48,"SizePrefixed",(allocator<char> *)&local_e8);
    GenDocComment(code_ptr);
    if (size_prefixed) {
      std::__cxx11::string::string((string *)&local_a8,local_48);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_e9);
    }
    std::operator+(&local_68,"static finish",&local_a8);
    std::operator+(&local_88,"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    std::operator+(&local_c8,&local_68,&local_88);
    std::operator+(&local_e8,&local_c8,"Buffer");
    std::__cxx11::string::append((string *)code);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::append((char *)code);
    std::__cxx11::string::append((char *)code);
    pPVar1 = (this->super_BaseGenerator).parser_;
    if ((pPVar1->file_identifier_)._M_string_length != 0) {
      std::operator+(&local_c8,", \'",&pPVar1->file_identifier_);
      std::operator+(&local_e8,&local_c8,"\'");
      std::__cxx11::string::append((string *)code);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    if (size_prefixed) {
      if ((((this->super_BaseGenerator).parser_)->file_identifier_)._M_string_length == 0) {
        std::__cxx11::string::append((char *)code);
      }
      std::__cxx11::string::append((char *)code);
    }
    std::__cxx11::string::append((char *)code);
    std::__cxx11::string::append((char *)code);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void GenerateFinisher(StructDef &struct_def, std::string *code_ptr,
                        std::string &code, bool size_prefixed) {
    if (parser_.root_struct_def_ == &struct_def) {
      std::string sizePrefixed("SizePrefixed");
      GenDocComment(code_ptr);

      code += "static finish" + (size_prefixed ? sizePrefixed : "") +
              GetPrefixedName(struct_def) + "Buffer";
      code += "(builder:flatbuffers.Builder, offset:flatbuffers.Offset) {\n";
      code += "  builder.finish(offset";
      if (!parser_.file_identifier_.empty()) {
        code += ", '" + parser_.file_identifier_ + "'";
      }
      if (size_prefixed) {
        if (parser_.file_identifier_.empty()) { code += ", undefined"; }
        code += ", true";
      }
      code += ");\n";
      code += "}\n\n";
    }
  }